

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O0

void ares_llist_node_detach(ares_llist_node_t *node)

{
  ares_llist_t *paVar1;
  ares_llist_t *list;
  ares_llist_node_t *node_local;
  
  if (node != (ares_llist_node_t *)0x0) {
    paVar1 = node->parent;
    if (node->prev != (ares_llist_node_t *)0x0) {
      node->prev->next = node->next;
    }
    if (node->next != (ares_llist_node_t *)0x0) {
      node->next->prev = node->prev;
    }
    if (node == paVar1->head) {
      paVar1->head = node->next;
    }
    if (node == paVar1->tail) {
      paVar1->tail = node->prev;
    }
    node->parent = (ares_llist_t *)0x0;
    paVar1->cnt = paVar1->cnt - 1;
  }
  return;
}

Assistant:

static void ares_llist_node_detach(ares_llist_node_t *node)
{
  ares_llist_t *list;

  if (node == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  list = node->parent;

  if (node->prev) {
    node->prev->next = node->next;
  }

  if (node->next) {
    node->next->prev = node->prev;
  }

  if (node == list->head) {
    list->head = node->next;
  }

  if (node == list->tail) {
    list->tail = node->prev;
  }

  node->parent = NULL;
  list->cnt--;
}